

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCall.cpp
# Opt level: O0

void __thiscall
ninx::parser::element::FunctionCall::FunctionCall
          (FunctionCall *this,string *name,
          vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
          *arguments,
          unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
          *outer_argument,bool late_call)

{
  bool late_call_local;
  unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
  *outer_argument_local;
  vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  *arguments_local;
  string *name_local;
  FunctionCall *this_local;
  
  Statement::Statement(&this->super_Statement);
  (this->super_Statement).super_ASTElement._vptr_ASTElement =
       (_func_int **)&PTR__FunctionCall_00288d38;
  std::__cxx11::string::string((string *)&this->name,(string *)name);
  std::
  vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  ::vector(&this->arguments,arguments);
  std::
  unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
  ::unique_ptr(&this->outer_argument,outer_argument);
  this->late_call = late_call;
  return;
}

Assistant:

ninx::parser::element::FunctionCall::FunctionCall(const std::string &name, std::vector<std::unique_ptr<FunctionCallArgument>> arguments,
                                                  std::unique_ptr<FunctionCallArgument> outer_argument, bool late_call)
        : name(name), arguments(std::move(arguments)), outer_argument(std::move(outer_argument)), late_call(late_call) {}